

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O2

ProcessInfo
llvm::sys::ExecuteNoWait
          (StringRef Program,ArrayRef<llvm::StringRef> Args,
          Optional<llvm::ArrayRef<llvm::StringRef>_> Env,
          ArrayRef<llvm::Optional<llvm::StringRef>_> Redirects,uint MemoryLimit,string *ErrMsg,
          bool *ExecutionFailed)

{
  bool bVar1;
  ProcessInfo PI;
  
  if ((Redirects.Length != 0) && (Redirects.Length != 3)) {
    __assert_fail("Redirects.empty() || Redirects.size() == 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Program.cpp"
                  ,0x39,
                  "ProcessInfo llvm::sys::ExecuteNoWait(StringRef, ArrayRef<StringRef>, Optional<ArrayRef<StringRef>>, ArrayRef<Optional<StringRef>>, unsigned int, std::string *, bool *)"
                 );
  }
  ProcessInfo::ProcessInfo(&PI);
  if (ExecutionFailed != (bool *)0x0) {
    *ExecutionFailed = false;
  }
  bVar1 = Execute(&PI,Program,Args,Env,Redirects,MemoryLimit,ErrMsg);
  if ((ExecutionFailed != (bool *)0x0) && (!bVar1)) {
    *ExecutionFailed = true;
  }
  return PI;
}

Assistant:

ProcessInfo sys::ExecuteNoWait(StringRef Program, ArrayRef<StringRef> Args,
                               Optional<ArrayRef<StringRef>> Env,
                               ArrayRef<Optional<StringRef>> Redirects,
                               unsigned MemoryLimit, std::string *ErrMsg,
                               bool *ExecutionFailed) {
  assert(Redirects.empty() || Redirects.size() == 3);
  ProcessInfo PI;
  if (ExecutionFailed)
    *ExecutionFailed = false;
  if (!Execute(PI, Program, Args, Env, Redirects, MemoryLimit, ErrMsg))
    if (ExecutionFailed)
      *ExecutionFailed = true;

  return PI;
}